

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

ModuleTreeNode * __thiscall
BtorSimVCDWriter::sort_names(BtorSimVCDWriter *this,Btor2Parser *model,string *topname)

{
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  Btor2Parser *pBVar2;
  long lVar3;
  ModuleTreeNode *this_00;
  Btor2Line *pBVar4;
  Btor2Sort *pBVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  allocator local_f9;
  BtorSimVCDWriter *local_f8;
  ModuleTreeNode *local_f0;
  Btor2Parser *local_e8;
  _Rb_tree_node_base *local_e0;
  string local_d8;
  pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i;
  string local_70;
  string local_50;
  
  local_f8 = this;
  local_e8 = model;
  this_00 = (ModuleTreeNode *)operator_new(0x68);
  local_f0 = this_00;
  std::__cxx11::string::string((string *)&local_d8,(string *)topname);
  ModuleTreeNode::ModuleTreeNode(this_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  pmVar1 = &local_f8->bv_identifiers;
  for (p_Var6 = (local_f8->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    std::
    pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&i,(pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var6 + 1));
    pBVar2 = local_e8;
    pBVar4 = (Btor2Line *)btor2parser_get_line_by_id(local_e8,i.first);
    pBVar5 = get_sort(pBVar4,pBVar2);
    lVar3 = i.first;
    std::__cxx11::string::string((string *)&local_50,pBVar4->symbol,&local_f9);
    this_00 = local_f0;
    ModuleTreeNode::sort_name
              (local_f0,lVar3,&local_50,(pBVar5->field_3).bitvec.width,local_f8->symbol_fmt);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&i.second);
  }
  local_e0 = &(local_f8->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var6 = (local_f8->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 != local_e0; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    std::
    pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&i,(pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var6 + 1));
    lVar3 = i.first;
    pBVar2 = local_e8;
    pBVar4 = (Btor2Line *)btor2parser_get_line_by_id(local_e8,i.first);
    pBVar5 = get_sort(pBVar4,pBVar2);
    lVar7 = btor2parser_get_line_by_id(pBVar2,(pBVar5->field_3).array.element);
    std::__cxx11::string::string((string *)&local_70,pBVar4->symbol,&local_f9);
    this_00 = local_f0;
    ModuleTreeNode::sort_name
              (local_f0,lVar3,&local_70,*(uint32_t *)(lVar7 + 0x38),local_f8->symbol_fmt);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&i);
  }
  return this_00;
}

Assistant:

ModuleTreeNode*
BtorSimVCDWriter::sort_names (Btor2Parser* model, std::string topname)
{
  ModuleTreeNode* top = new ModuleTreeNode (topname);
  for (auto i : bv_identifiers)
  {
    Btor2Line* l = btor2parser_get_line_by_id (model, i.first);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_bitvec);
    top->sort_name (
        i.first, std::string (l->symbol), sort->bitvec.width, symbol_fmt);
  }
  for (auto i : am_identifiers)
  {
    int64_t id   = i.first.first;
    Btor2Line* l = btor2parser_get_line_by_id (model, id);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_array);
    Btor2Line* le = btor2parser_get_line_by_id (model, sort->array.element);
    top->sort_name (
        id, std::string (l->symbol), le->sort.bitvec.width, symbol_fmt);
  }
  return top;
}